

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

bool reciprocal_check(double a,double b)

{
  double b_local;
  double a_local;
  
  if (0.0 < a) {
    if (a <= b) {
      a_local._7_1_ = true;
    }
    else {
      std::operator<<((ostream *)&std::cout," \n");
      std::operator<<((ostream *)&std::cout,"RECIPROCAL_CHECK - Warning!\n");
      std::operator<<((ostream *)&std::cout,"  B < A\n");
      a_local._7_1_ = false;
    }
  }
  else {
    std::operator<<((ostream *)&std::cout," \n");
    std::operator<<((ostream *)&std::cout,"RECIPROCAL_CHECK - Warning!\n");
    std::operator<<((ostream *)&std::cout,"  A <= 0.0\n");
    a_local._7_1_ = false;
  }
  return a_local._7_1_;
}

Assistant:

bool reciprocal_check ( double a, double b )

//****************************************************************************80
//
//  Purpose:
//
//    RECIPROCAL_CHECK checks the parameters of the Reciprocal CDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    18 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double A, B, the parameters of the PDF.
//    0.0 < A <= B.
//
//    Output, bool RECIPROCAL_CHECK, is true if the parameters are legal.
//
{
  if ( a <= 0.0 )
  {
    cout << " \n";
    cout << "RECIPROCAL_CHECK - Warning!\n";
    cout << "  A <= 0.0\n";
    return false;
  }

  if ( b < a )
  {
    cout << " \n";
    cout << "RECIPROCAL_CHECK - Warning!\n";
    cout << "  B < A\n";
    return false;
  }

  return true;
}